

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void * install_response_handler
                 (CManager cm,int stone_id,char *response_spec,void *local_data,FMFormat **ref_ptr)

{
  int iVar1;
  FMFormat p_Var2;
  undefined8 *puVar3;
  void *pvVar4;
  void *pvVar5;
  char *__dest;
  undefined8 in_RCX;
  char *in_RDX;
  undefined8 *in_R8;
  int k_1;
  FMFormat *formats_3;
  FMStructDescList in_list_1;
  int k;
  int format_count2;
  int accept_anonymous;
  FMStructDescList *struct_list;
  char *function_3;
  int j;
  int list_count;
  response_spec *response_3;
  FMFormat *formats_2;
  FMStructDescList out_list;
  FMStructDescList in_list;
  char *function_2;
  int i_3;
  int format_count_3;
  response_spec *response_2;
  FMFormat *formats_1;
  FMStructDescList list_2;
  char *function_1;
  int i_2;
  int format_count_2;
  response_spec *response_1;
  FMFormat *formats;
  FMStructDescList list_1;
  char *function;
  int i_1;
  int format_count_1;
  response_spec *response;
  FMStructDescList list;
  int i;
  int format_count;
  char *str;
  FMStructDescList in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar6;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_d8;
  int local_d4;
  undefined4 *local_d0;
  undefined8 *local_c8;
  long *local_c0;
  long *local_b8;
  char *local_b0;
  int local_a8;
  int local_a4;
  undefined4 *local_a0;
  void *local_90;
  char *local_88;
  int local_80;
  int local_7c;
  undefined4 *local_78;
  void *local_68;
  char *local_60;
  int local_58;
  int local_54;
  undefined4 *local_50;
  void *local_48;
  int local_40;
  int local_3c;
  char *local_38;
  undefined8 *local_30;
  undefined8 local_28;
  undefined4 *local_8;
  
  local_38 = in_RDX;
  local_30 = in_R8;
  local_28 = in_RCX;
  iVar1 = strncmp("Terminal Action",in_RDX,0xf);
  if (iVar1 == 0) {
    local_38 = local_38 + 0x10;
    __isoc99_sscanf(local_38,"  Format Count %d\n",&local_3c);
    local_38 = strchr(local_38,10);
    local_38 = local_38 + 1;
    local_48 = INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
      local_38 = parse_FMformat_from_string
                           ((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (FMStructDescRec *)
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    *(undefined8 *)((long)local_48 + (long)local_3c * 0x20) = 0;
  }
  iVar1 = strncmp("Filter Action",local_38,0xd);
  if (iVar1 == 0) {
    local_50 = (undefined4 *)
               INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_38 = local_38 + 0xe;
    __isoc99_sscanf(local_38,"  Format Count %d\n",&local_54);
    local_38 = strchr(local_38,10);
    local_38 = local_38 + 1;
    local_68 = INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
      local_38 = parse_FMformat_from_string
                           ((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (FMStructDescRec *)
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    *(undefined8 *)((long)local_68 + (long)local_54 * 0x20) = 0;
    strlen(local_38);
    local_60 = (char *)INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    strcpy(local_60,local_38);
    *local_50 = 0;
    *(void **)(local_50 + 2) = local_68;
    *(char **)(local_50 + 4) = local_60;
    *(undefined8 *)(local_50 + 6) = local_28;
    p_Var2 = EVregister_format_set
                       ((CManager_conflict)
                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffee8);
    *(FMFormat *)(local_50 + 8) = p_Var2;
    if (local_30 != (undefined8 *)0x0) {
      puVar3 = (undefined8 *)
               INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      puVar3[1] = 0;
      *puVar3 = *(undefined8 *)(local_50 + 8);
      *local_30 = puVar3;
    }
    local_8 = local_50;
  }
  else {
    iVar1 = strncmp("Router Action",local_38,0xd);
    if (iVar1 == 0) {
      local_78 = (undefined4 *)
                 INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_38 = local_38 + 0xe;
      __isoc99_sscanf(local_38,"  Format Count %d\n",&local_7c);
      local_38 = strchr(local_38,10);
      local_38 = local_38 + 1;
      local_90 = INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      for (local_80 = 0; local_80 < local_7c; local_80 = local_80 + 1) {
        local_38 = parse_FMformat_from_string
                             ((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              (FMStructDescRec *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      *(undefined8 *)((long)local_90 + (long)local_7c * 0x20) = 0;
      strlen(local_38);
      local_88 = (char *)INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
      ;
      strcpy(local_88,local_38);
      *local_78 = 2;
      *(void **)(local_78 + 2) = local_90;
      *(char **)(local_78 + 4) = local_88;
      *(undefined8 *)(local_78 + 6) = local_28;
      p_Var2 = EVregister_format_set
                         ((CManager_conflict)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          in_stack_fffffffffffffee8);
      *(FMFormat *)(local_78 + 8) = p_Var2;
      if (local_30 != (undefined8 *)0x0) {
        puVar3 = (undefined8 *)
                 INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        puVar3[1] = 0;
        *puVar3 = *(undefined8 *)(local_78 + 8);
        *local_30 = puVar3;
      }
      local_8 = local_78;
    }
    else {
      iVar1 = strncmp("Transform Action",local_38,0x10);
      if (iVar1 == 0) {
        local_a0 = (undefined4 *)
                   INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        local_38 = local_38 + 0x11;
        __isoc99_sscanf(local_38,"  Input Format Count %d\n",&local_a4);
        local_38 = strchr(local_38,10);
        local_38 = local_38 + 1;
        local_b8 = (long *)INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ));
        for (local_a8 = 0; local_a8 < local_a4; local_a8 = local_a8 + 1) {
          local_38 = parse_FMformat_from_string
                               ((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                ),
                                (FMStructDescRec *)
                                CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        }
        local_b8[(long)local_a4 * 4] = 0;
        local_b8[(long)local_a4 * 4 + 1] = 0;
        iVar1 = __isoc99_sscanf(local_38,"  Output Format Count %d\n",&local_a4);
        if (iVar1 == 1) {
          local_38 = strchr(local_38,10);
          local_38 = local_38 + 1;
          local_c0 = (long *)INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0));
          for (local_a8 = 0; local_a8 < local_a4; local_a8 = local_a8 + 1) {
            local_38 = parse_FMformat_from_string
                                 ((char *)CONCAT44(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10),
                                  (FMStructDescRec *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          }
          local_c0[(long)local_a4 * 4] = 0;
          local_c0[(long)local_a4 * 4 + 1] = 0;
          strlen(local_38);
          local_b0 = (char *)INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0));
          strcpy(local_b0,local_38);
          *local_a0 = 1;
          *(long **)(local_a0 + 2) = local_b8;
          *(long **)(local_a0 + 4) = local_c0;
          *(char **)(local_a0 + 6) = local_b0;
          *(undefined8 *)(local_a0 + 8) = local_28;
          *(undefined8 *)(local_a0 + 10) = 0;
          if (*local_b8 != 0) {
            p_Var2 = EVregister_format_set
                               ((CManager_conflict)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                in_stack_fffffffffffffee8);
            *(FMFormat *)(local_a0 + 10) = p_Var2;
          }
          if (local_30 != (undefined8 *)0x0) {
            local_c8 = (undefined8 *)
                       INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            local_c8[1] = 0;
            *local_c8 = *(undefined8 *)(local_a0 + 10);
            *local_30 = local_c8;
          }
          if (*local_c0 != 0) {
            p_Var2 = EVregister_format_set
                               ((CManager_conflict)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                in_stack_fffffffffffffee8);
            *(FMFormat *)(local_a0 + 0xc) = p_Var2;
          }
          local_a0[0x10] = (int)local_c0[2];
          local_8 = local_a0;
        }
        else {
          printf("output format parse failed\n");
          local_8 = (undefined4 *)0x0;
        }
      }
      else {
        iVar1 = strncmp("Multityped Action",local_38,0x11);
        if (iVar1 == 0) {
          local_d0 = (undefined4 *)
                     INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          iVar1 = 0;
          local_38 = local_38 + 0x12;
          __isoc99_sscanf(local_38,"  List Count %d\n",&local_d4);
          local_38 = strchr(local_38,10);
          local_38 = local_38 + 1;
          pvVar4 = INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          for (local_d8 = 0; local_d8 < local_d4; local_d8 = local_d8 + 1) {
            __isoc99_sscanf(local_38,"Next format   Subformat Count %d\n",&stack0xffffffffffffff10);
            local_38 = strchr(local_38,10);
            local_38 = local_38 + 1;
            pvVar5 = INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            for (iVar6 = 0; iVar6 < in_stack_ffffffffffffff10; iVar6 = iVar6 + 1) {
              local_38 = parse_FMformat_from_string
                                   ((char *)CONCAT44(iVar1,in_stack_ffffffffffffff10),
                                    (FMStructDescRec *)CONCAT44(iVar6,in_stack_ffffffffffffff08));
            }
            *(undefined8 *)((long)pvVar5 + (long)in_stack_ffffffffffffff10 * 0x20) = 0;
            *(undefined8 *)((long)pvVar5 + (long)in_stack_ffffffffffffff10 * 0x20 + 8) = 0;
            *(void **)((long)pvVar4 + (long)local_d8 * 8) = pvVar5;
            if (*(long *)(*(long *)((long)pvVar4 + (long)local_d8 * 8) + 8) == 0) {
              free((void *)**(undefined8 **)((long)pvVar4 + (long)local_d8 * 8));
              free(pvVar5);
              *(undefined8 *)((long)pvVar4 + (long)local_d8 * 8) = 0;
              local_d4 = local_d4 + -1;
              local_d8 = local_d8 + -1;
              iVar1 = iVar1 + 1;
            }
          }
          *(undefined8 *)((long)pvVar4 + (long)local_d4 * 8) = 0;
          strlen(local_38);
          __dest = (char *)INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ));
          strcpy(__dest,local_38);
          *local_d0 = 3;
          *(void **)(local_d0 + 2) = pvVar4;
          *(char **)(local_d0 + 4) = __dest;
          *(undefined8 *)(local_d0 + 6) = local_28;
          local_d0[8] = iVar1;
          pvVar5 = INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          *(void **)(local_d0 + 10) = pvVar5;
          for (local_d8 = 0; local_d8 < local_d4; local_d8 = local_d8 + 1) {
            if (**(long **)((long)pvVar4 + (long)local_d8 * 8) != 0) {
              p_Var2 = EVregister_format_set
                                 ((CManager_conflict)
                                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  in_stack_fffffffffffffee8);
              *(FMFormat *)(*(long *)(local_d0 + 10) + (long)local_d8 * 8) = p_Var2;
            }
          }
          if (local_30 != (undefined8 *)0x0) {
            pvVar4 = INT_CMmalloc(CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            for (iVar1 = 0; iVar1 < local_d4; iVar1 = iVar1 + 1) {
              *(undefined8 *)((long)pvVar4 + (long)iVar1 * 8) =
                   *(undefined8 *)(*(long *)(local_d0 + 10) + (long)iVar1 * 8);
            }
            *(undefined8 *)((long)pvVar4 + (long)local_d4 * 8) = 0;
            *local_30 = pvVar4;
          }
          local_8 = local_d0;
        }
        else {
          printf("Unparsed action : %s\n",local_38);
          local_8 = (undefined4 *)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

void *
install_response_handler(CManager cm, int stone_id, char *response_spec,
			 void *local_data, FMFormat **ref_ptr)
{
    char *str = response_spec;
    (void)stone_id;
    if (strncmp("Terminal Action", str, strlen("Terminal Action")) == 0) {
	int format_count, i;
	FMStructDescList list;
	str += strlen("Terminal Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
/*	INT_EVassoc_terminal_action(cm, stone_id, list, local_data, NULL);*/
    }
    if (strncmp("Filter Action", str, strlen("Filter Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList list;
	str += strlen("Filter Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Filter;
	response->u.filter.format_list = list;
	response->u.filter.function = function;
	response->u.filter.client_data = local_data;
	response->u.filter.reference_format =
	    EVregister_format_set(cm, list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.filter.reference_format;

	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    if (strncmp("Router Action", str, strlen("Router Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList list;
	str += strlen("Router Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Router;
	response->u.filter.format_list = list;
	response->u.filter.function = function;
	response->u.filter.client_data = local_data;
	response->u.filter.reference_format =
	    EVregister_format_set(cm, list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.filter.reference_format;

	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    if (strncmp("Transform Action", str, strlen("Transform Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList in_list, out_list;
	str += strlen("Transform Action") + 1;
	sscanf(str, "  Input Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	in_list = malloc(sizeof(in_list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &in_list[i]);
	}
	in_list[format_count].format_name = NULL;
	in_list[format_count].field_list = NULL;
	if (sscanf(str, "  Output Format Count %d\n", &format_count) != 1) {
	    printf("output format parse failed\n");
	    return 0;
	}
	str = strchr(str, '\n') + 1;
	out_list = malloc(sizeof(out_list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &out_list[i]);
	}
	out_list[format_count].format_name = NULL;
	out_list[format_count].field_list = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Transform;
	response->u.transform.in_format_list = in_list;
	response->u.transform.out_format_list = out_list;
	response->u.transform.function = function;
	response->u.transform.client_data = local_data;
	response->u.transform.reference_input_format = NULL;
	if (in_list[0].format_name != NULL)
	    response->u.transform.reference_input_format =
		EVregister_format_set(cm, in_list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.transform.reference_input_format;
	    *ref_ptr = formats;
	}
	if (out_list[0].format_name != NULL)
	    response->u.transform.reference_output_format =
		EVregister_format_set(cm, out_list);
	response->u.transform.output_base_struct_size = out_list[0].struct_size;
	return (void*)response;
    }
    if (strncmp("Multityped Action", str, strlen("Multityped Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int list_count, j;
	char *function;
	FMStructDescList *struct_list;
	int accept_anonymous = 0;

	str += strlen("Multityped Action") + 1;
	sscanf(str, "  List Count %d\n", &list_count);
	str = strchr(str, '\n') + 1;
	struct_list = malloc(sizeof(struct_list[0]) * (list_count + 1));
	for (j = 0; j < list_count; j++) {
	    int format_count2, k;
	    FMStructDescList in_list;
	    sscanf(str, "Next format   Subformat Count %d\n", &format_count2);
	    str = strchr(str, '\n') + 1;

	    in_list = malloc(sizeof(in_list[0]) * (format_count2 + 1));
	    for (k=0; k < format_count2; k++) {
		str = parse_FMformat_from_string(str, &in_list[k]);
	    }
	    in_list[format_count2].format_name = NULL;
	    in_list[format_count2].field_list = NULL;
	    struct_list[j] = in_list;
	    if (struct_list[j]->field_list == NULL) {  /* anonymous */
		free((void*)struct_list[j]->format_name);
		free(in_list);
		struct_list[j] = NULL;
		list_count--;
		j--;
		accept_anonymous++;
	    }
	}
	struct_list[list_count] = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Multityped;
	response->u.multityped.struct_list = struct_list;
	response->u.multityped.function = function;
	response->u.multityped.client_data = local_data;
	response->u.multityped.accept_anonymous = accept_anonymous;
	response->u.multityped.reference_input_format_list =
	    malloc((list_count +1) * sizeof(FMFormat));
	for (j = 0; j < list_count; j++) {
	    if ((struct_list[j])[0].format_name != NULL) {
		response->u.multityped.reference_input_format_list[j] =
		    EVregister_format_set(cm, struct_list[j]);
	    }
	}
	if (ref_ptr) {
	    FMFormat *formats = malloc((list_count + 1)*sizeof(FMFormat));
	    int k = 0;
	    for (k=0; k < list_count; k++) {
		formats[k] = response->u.multityped.reference_input_format_list[k];
	    }
	    formats[list_count] = NULL;
	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    printf("Unparsed action : %s\n", str);
    return NULL;
}